

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)3,google::protobuf::internal::BoundedZCIS>
          (MessageLite *this,BoundedZCIS *input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  ClassDataFull *pCVar4;
  ParseFlags in_R9D;
  BoundedZCIS input_00;
  TcParseTableBase *tc_table;
  bool alias;
  BoundedZCIS *input_local;
  MessageLite *this_local;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  LogMessageFatal local_80 [23];
  Voidify local_69;
  TcParseTableBase *local_68;
  TcParseTableBase *tc_table_1;
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  ClassData *local_20;
  ClassData *data;
  TcParseTableBase *local_10;
  
  (*this->_vptr_MessageLite[2])();
  data = (ClassData *)this;
  iVar2 = (*this->_vptr_MessageLite[4])();
  local_20 = (ClassData *)CONCAT44(extraout_var,iVar2);
  local_49 = 0;
  if (local_20 == (ClassData *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"data != nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
               ,0x35e,local_48._M_len,local_48._M_str);
    local_49 = 1;
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  local_68 = local_20->tc_table;
  local_10 = local_68;
  if (local_68 == (TcParseTableBase *)0x0) {
    if ((local_20->is_lite & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_90,"!data->is_lite");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
                 ,0x362,local_90._M_len,local_90._M_str);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_80);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_69,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_80);
    }
    pCVar4 = internal::ClassData::full(local_20);
    local_10 = (*pCVar4->descriptor_methods->get_tc_table)(this);
  }
  input_00.zcis = (ZeroCopyInputStream *)(*(ulong *)&input->limit & 0xffffffff);
  input_00._8_8_ = this;
  bVar1 = internal::MergeFromImpl<false>
                    ((internal *)input->zcis,input_00,(MessageLite *)local_10,
                     (TcParseTableBase *)0x3,in_R9D);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}